

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

void __thiscall
QPixmapStyle::drawControl
          (QPixmapStyle *this,ControlElement element,QStyleOption *option,QPainter *painter,
          QWidget *widget)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  QRect local_c8;
  QPixmapStylePixmap local_b8;
  QPixmapStyleDescriptor local_90;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)element < 0xd) {
    if (element == CE_ProgressBarGroove) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        drawProgressBarBackground(this,option,painter,(QWidget *)painter);
        return;
      }
      goto LAB_003448aa;
    }
    if (element == CE_ProgressBarContents) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        drawProgressBarFill(this,option,painter,(QWidget *)painter);
        return;
      }
      goto LAB_003448aa;
    }
  }
  else {
    if (element == CE_ProgressBarLabel) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        drawProgressBarLabel(this,option,painter,(QWidget *)painter);
        return;
      }
      goto LAB_003448aa;
    }
    if (element == CE_ShapedFrame) {
      lVar1 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
      (*(code *)**(undefined8 **)widget)(widget);
      pcVar8 = (char *)QMetaObject::className();
      iVar6 = qstrcmp(pcVar8,"QComboBoxPrivateContainer");
      if (iVar6 == 0) {
        local_b8.pixmap = (QPixmap)0x1f;
        local_b8._1_3_ = 0;
        QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
                  (&local_90,
                   (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)(lVar1 + 0xe8),
                   (ControlDescriptor *)&local_b8);
        local_58._0_4_ = 0x15;
        QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
                  (&local_b8,
                   (QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)(lVar1 + 0xf0),
                   (ControlPixmap *)local_58.data);
        uVar2 = (option->rect).x1;
        uVar3 = (option->rect).y1;
        uVar4 = (option->rect).x2;
        uVar5 = (option->rect).y2;
        local_c8.y1.m_i = uVar3 - local_90.margins.m_top.m_i;
        local_c8.x1.m_i = uVar2 - local_b8.margins.m_left.m_i;
        local_c8.y2.m_i = uVar5 + local_90.margins.m_bottom.m_i;
        local_c8.x2.m_i = uVar4 + local_b8.margins.m_right.m_i;
        QObject::property((char *)local_58.data);
        uVar7 = ::QVariant::toBool();
        ::QVariant::~QVariant((QVariant *)&local_58);
        drawCachedPixmap(this,(uVar7 & 0xff) + DD_PopupDown,&local_c8,painter);
        QPixmap::~QPixmap(&local_b8.pixmap);
        if (&(local_90.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_90.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_90.fileName.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
        goto LAB_003448aa;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003448aa;
      element = CE_ShapedFrame;
      goto LAB_0034471d;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0034471d:
    QCommonStyle::drawControl(&this->super_QCommonStyle,element,option,painter,widget);
    return;
  }
LAB_003448aa:
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::drawControl(ControlElement element, const QStyleOption *option,
                               QPainter *painter, const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    switch (element) {
    case CE_ProgressBarGroove:
        drawProgressBarBackground(option, painter, widget);
        break;
    case CE_ProgressBarLabel:
        drawProgressBarLabel(option, painter, widget);
        break;
    case CE_ProgressBarContents:
        drawProgressBarFill(option, painter, widget);
        break;
    case CE_ShapedFrame:
        // NOTE: This will break if the private API of QComboBox changes drastically
        if (qstrcmp(widget->metaObject()->className(),"QComboBoxPrivateContainer") == 0) {
            const QPixmapStyleDescriptor &desc = d->descriptors.value(DD_PopupDown);
            const QPixmapStylePixmap &pix = d->pixmaps.value(DD_ItemSeparator);
            QRect rect = option->rect;
            rect.adjust(-pix.margins.left(), -desc.margins.top(),
                        pix.margins.right(), desc.margins.bottom());
            bool up = widget->property("_pixmapstyle_combobox_up").toBool();
            drawCachedPixmap(up ? DD_PopupUp : DD_PopupDown, rect, painter);
        }
        else {
            QCommonStyle::drawControl(element, option, painter, widget);
        }
        break;
    default:
        QCommonStyle::drawControl(element, option, painter, widget);
    }
}